

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# edge-segments.cpp
# Opt level: O3

Point2 __thiscall msdfgen::CubicSegment::point(CubicSegment *this,double param)

{
  double value;
  Vector2 VVar1;
  Point2 PVar2;
  Vector2 local_88;
  Vector2 local_78;
  double local_68;
  double local_60;
  Vector2 local_58;
  Vector2 local_48;
  double local_38;
  double local_30;
  
  local_78.x = this->p[1].x;
  local_78.y = this->p[1].y;
  local_88.x = this->p[2].x;
  local_88.y = this->p[2].y;
  value = 1.0 - param;
  VVar1 = operator*(value,&local_78);
  local_48.x = VVar1.x;
  local_48.y = VVar1.y;
  VVar1 = operator*(param,&local_88);
  local_58.x = VVar1.x;
  local_58.y = VVar1.y;
  VVar1 = Vector2::operator+(&local_48,&local_58);
  local_60 = VVar1.x;
  local_68 = VVar1.y;
  local_78.x = this->p[0].x;
  local_78.y = this->p[0].y;
  local_88.x = this->p[1].x;
  local_88.y = this->p[1].y;
  VVar1 = operator*(value,&local_78);
  local_48.x = VVar1.x;
  local_48.y = VVar1.y;
  VVar1 = operator*(param,&local_88);
  local_58.x = VVar1.x;
  local_58.y = VVar1.y;
  VVar1 = Vector2::operator+(&local_48,&local_58);
  local_78.x = VVar1.x;
  local_78.y = VVar1.y;
  local_88.x = local_60;
  local_88.y = local_68;
  VVar1 = operator*(value,&local_78);
  local_48.x = VVar1.x;
  local_48.y = VVar1.y;
  VVar1 = operator*(param,&local_88);
  local_58.x = VVar1.x;
  local_58.y = VVar1.y;
  VVar1 = Vector2::operator+(&local_48,&local_58);
  local_30 = VVar1.x;
  local_38 = VVar1.y;
  local_78.x = this->p[2].x;
  local_78.y = this->p[2].y;
  local_88.x = this->p[3].x;
  local_88.y = this->p[3].y;
  VVar1 = operator*(value,&local_78);
  local_48.x = VVar1.x;
  local_48.y = VVar1.y;
  VVar1 = operator*(param,&local_88);
  local_58.x = VVar1.x;
  local_58.y = VVar1.y;
  VVar1 = Vector2::operator+(&local_48,&local_58);
  local_78.x = local_60;
  local_78.y = local_68;
  local_88.x = VVar1.x;
  local_88.y = VVar1.y;
  VVar1 = operator*(value,&local_78);
  local_48.x = VVar1.x;
  local_48.y = VVar1.y;
  VVar1 = operator*(param,&local_88);
  local_58.x = VVar1.x;
  local_58.y = VVar1.y;
  VVar1 = Vector2::operator+(&local_48,&local_58);
  local_78.x = local_30;
  local_78.y = local_38;
  local_88.x = VVar1.x;
  local_88.y = VVar1.y;
  VVar1 = operator*(value,&local_78);
  local_48.x = VVar1.x;
  local_48.y = VVar1.y;
  VVar1 = operator*(param,&local_88);
  local_58.x = VVar1.x;
  local_58.y = VVar1.y;
  VVar1 = Vector2::operator+(&local_48,&local_58);
  PVar2.x = VVar1.x;
  PVar2.y = VVar1.y;
  return PVar2;
}

Assistant:

Point2 CubicSegment::point(double param) const {
    Vector2 p12 = mix(p[1], p[2], param);
    return mix(mix(mix(p[0], p[1], param), p12, param), mix(p12, mix(p[2], p[3], param), param), param);
}